

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  FILE *pFVar3;
  FILE *anmfp_00;
  anm_entry_t *anm_00;
  int iVar4;
  int iVar5;
  FILE *__stream;
  int *piVar6;
  char *pcVar7;
  anm_entry_t *entry_first;
  void *pvVar8;
  char *local_208;
  anm_entry_t *local_1f0;
  long *local_1e8;
  FILE *local_1d0;
  anm_entry_t *local_1b0;
  list_node_t *local_1a8;
  char *local_198;
  anm_entry_t *local_190;
  list_node_t *local_188;
  char *local_178;
  char *local_170;
  char *local_160;
  char *local_110;
  list_node_t *node_7;
  list_node_t *node_6;
  list_node_t *node_5;
  list_node_t *node_4;
  char *filename_2;
  list_node_t *node_3;
  list_node_t *plStack_d8;
  int j_2;
  list_node_t *node_2;
  list_t anms;
  char *filename_1;
  list_node_t *node_1;
  char *pcStack_a8;
  int j_1;
  char *filename;
  list_node_t *node;
  int j;
  FILE *map_file;
  int local_80;
  int ind;
  int opt;
  int i;
  FILE *symbolfp;
  FILE *anmfp;
  char *name;
  anm_entry_t *entry;
  anm_archive_t *anm;
  FILE *pFStack_48;
  uint version;
  FILE *in;
  char acStack_38 [4];
  int command;
  char commands [21];
  char **argv_local;
  int argc_local;
  
  g_anmmap = anmmap_new();
  atexit(free_globals);
  _acStack_38 = 0x3a783a6d6f3a6c3a;
  builtin_strncpy(commands,"X:r:c:s:Vfuv",0xd);
  in._4_4_ = -1;
  anm._4_4_ = 0;
  _opt = (FILE *)0x0;
  argv0 = util_shortname(*argv);
  map_file._4_4_ = 0;
  while (iVar5 = map_file._4_4_, argv[util_optind] != (char *)0x0) {
    local_80 = util_getopt(argc,argv,acStack_38);
    switch(local_80) {
    default:
      util_getopt_default((int *)((long)&map_file + 4),argv,local_80,print_usage);
      break;
    case 99:
      if (option_print_offsets != 0) {
        fprintf(_stderr,"%s: \'o\' option can\'t be used when creating ANM archive\n",argv0);
        exit(1);
      }
    case 0x58:
    case 0x6c:
    case 0x72:
    case 0x78:
      if (in._4_4_ != -1) {
        fprintf(_stderr,"%s: More than one mode specified\n",argv0);
        print_usage();
        exit(1);
      }
      in._4_4_ = local_80;
      anm._4_4_ = parse_version(util_optarg);
      break;
    case 0x66:
      option_force = 1;
      break;
    case 0x6d:
      __stream = fopen(util_optarg,"r");
      pFVar3 = _stderr;
      pcVar2 = util_optarg;
      pcVar1 = argv0;
      if (__stream == (FILE *)0x0) {
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        fprintf(pFVar3,"%s: couldn\'t open %s for reading: %s\n",pcVar1,pcVar2,pcVar7);
      }
      else {
        anmmap_load(g_anmmap,(FILE *)__stream,util_optarg);
        fclose(__stream);
      }
      break;
    case 0x6f:
      if (in._4_4_ == 99) {
        fprintf(_stderr,"%s: \'o\' option can\'t be used when creating ANM archive\n",argv0);
        exit(1);
      }
      option_print_offsets = 1;
      break;
    case 0x73:
      _opt = fopen(util_optarg,"w");
      pFVar3 = _stderr;
      pcVar2 = util_optarg;
      pcVar1 = argv0;
      if (_opt == (FILE *)0x0) {
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        fprintf(pFVar3,"%s: couldn\'t open %s for writing: %s\n",pcVar1,pcVar2,pcVar7);
      }
      break;
    case 0x75:
      if (option_unique_filenames == 0) {
        option_unique_filenames = 1;
      }
      else {
        option_dont_add_offset_border = 1;
      }
      break;
    case 0x76:
      option_verbose = option_verbose + 1;
    }
  }
  argv[map_file._4_4_] = (char *)0x0;
  if (in._4_4_ != -1) {
    switch(anm._4_4_) {
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x5f:
    case 0x67:
    case 0x7d:
    case 0x80:
    case 0x8f:
    case 0xa5:
    case 0xb9:
      goto code_r0x0010dc3a;
    default:
      if (anm._4_4_ == 0) {
        fprintf(_stderr,"%s: version must be specified\n",argv0);
      }
      else {
        fprintf(_stderr,"%s: version %u is unsupported\n",argv0,(ulong)anm._4_4_);
      }
      exit(1);
    }
  }
  print_usage();
  exit(1);
code_r0x0010dc3a:
  switch(in._4_4_) {
  case 0x58:
    list_init((list_t *)&node_2);
    if (iVar5 < 1) {
      print_usage();
      exit(1);
    }
    ind = 0;
    while( true ) {
      if (iVar5 <= ind) {
        anm_build_name_lists_multiple((list_t *)&node_2);
        ind = 0;
        plStack_d8 = node_2;
        while( true ) {
          if (plStack_d8 == (list_node_t *)0x0) {
            local_190 = (anm_entry_t *)0x0;
          }
          else {
            local_190 = (anm_entry_t *)plStack_d8->data;
          }
          entry = local_190;
          if (plStack_d8 == (list_node_t *)0x0) break;
          node_3._4_4_ = 0;
          filename_2 = local_190->filename;
          while( true ) {
            if (filename_2 == (char *)0x0) {
              local_198 = (char *)0x0;
            }
            else {
              local_198 = *(char **)(filename_2 + 0x10);
            }
            name = local_198;
            if (filename_2 == (char *)0x0) break;
            if (*(int *)(local_198 + 0x30) == 0) {
              node_4 = (list_node_t *)0x0;
              current_output = *(char **)(local_198 + 0x10);
              if (option_verbose != 0) {
                fprintf(_stderr,"%s\n",*(undefined8 *)(local_198 + 0x10));
              }
              if (option_unique_filenames != 0) {
                node_4 = (list_node_t *)
                         anm_make_unique_filename(*(char **)(name + 0x10),argv[ind],node_3._4_4_);
              }
              if (node_4 == (list_node_t *)0x0) {
                local_1a8 = *(list_node_t **)(name + 0x10);
              }
              else {
                local_1a8 = node_4;
              }
              anm_extract((anm_entry_t *)name,(char *)local_1a8,anm._4_4_);
              free(node_4);
            }
            node_3._4_4_ = node_3._4_4_ + 1;
            filename_2 = *(char **)filename_2;
          }
          ind = ind + 1;
          plStack_d8 = plStack_d8->next;
        }
        node_5 = node_2;
        while( true ) {
          if (node_5 == (list_node_t *)0x0) {
            local_1b0 = (anm_entry_t *)0x0;
          }
          else {
            local_1b0 = (anm_entry_t *)node_5->data;
          }
          entry = local_1b0;
          if (node_5 == (list_node_t *)0x0) break;
          anm_free((anm_archive_t *)local_1b0);
          node_5 = node_5->next;
        }
        list_free_nodes((list_t *)&node_2);
        exit(0);
      }
      current_input = argv[ind];
      pFStack_48 = fopen(argv[ind],"rb");
      if (pFStack_48 == (FILE *)0x0) break;
      entry = (anm_entry_t *)anm_read_file((FILE *)pFStack_48,anm._4_4_);
      list_append_new((list_t *)&node_2,entry);
      fclose(pFStack_48);
      ind = ind + 1;
    }
    fprintf(_stderr,"%s: couldn\'t open %s for reading\n",argv0,current_input);
    exit(1);
  default:
    print_usage();
    exit(1);
  case 99:
    if (map_file._4_4_ != 2) {
      print_usage();
      exit(1);
    }
    current_input = argv[1];
    entry = (anm_entry_t *)anm_create(argv[1],(FILE *)_opt,anm._4_4_);
    if (_opt != (FILE *)0x0) {
      fclose(_opt);
    }
    if (entry == (anm_entry_t *)0x0) {
      exit(0);
    }
    anm_defaults((anm_archive_t *)entry,anm._4_4_);
    if (option_unique_filenames == 0) {
      anm_build_name_lists((anm_archive_t *)entry);
    }
    node_7 = (list_node_t *)entry->filename;
    while( true ) {
      if (node_7 == (list_node_t *)0x0) {
        local_1e8 = (long *)0x0;
      }
      else {
        local_1e8 = (long *)node_7->data;
      }
      name = (char *)local_1e8;
      if (node_7 == (list_node_t *)0x0) break;
      if ((*(short *)(*local_1e8 + 0x34) != 0) && (local_1e8[0xb] == 0)) {
        pvVar8 = calloc(1,(ulong)*(uint *)(local_1e8[1] + 0xc));
        *(void **)(name + 0x58) = pvVar8;
      }
      node_7 = node_7->next;
    }
    local_110 = entry->filename;
    while( true ) {
      if (local_110 == (char *)0x0) {
        local_1f0 = (anm_entry_t *)0x0;
      }
      else {
        local_1f0 = *(anm_entry_t **)(local_110 + 0x10);
      }
      name = (char *)local_1f0;
      if (local_110 == (char *)0x0) break;
      if (local_1f0->processed == 0) {
        if (local_1f0->filename == (char *)0x0) {
          local_208 = local_1f0->name;
        }
        else {
          local_208 = local_1f0->filename;
        }
        anm_replace((anm_archive_t *)entry,(FILE *)0x0,local_1f0,local_208,anm._4_4_);
      }
      local_110 = *(char **)local_110;
    }
    current_output = *argv;
    anm_write((anm_archive_t *)entry,*argv,anm._4_4_);
    anm_free((anm_archive_t *)entry);
    exit(0);
  case 0x6c:
    if (map_file._4_4_ != 1) {
      print_usage();
      exit(1);
    }
    current_input = *argv;
    pFStack_48 = fopen(*argv,"rb");
    if (pFStack_48 == (FILE *)0x0) {
      fprintf(_stderr,"%s: couldn\'t open %s for reading\n",argv0,current_input);
      exit(1);
    }
    entry = (anm_entry_t *)anm_read_file((FILE *)pFStack_48,anm._4_4_);
    fclose(pFStack_48);
    anm_dump(_stdout,(anm_archive_t *)entry,anm._4_4_,*argv);
    anm_free((anm_archive_t *)entry);
    exit(0);
  case 0x72:
    break;
  case 0x78:
    if (map_file._4_4_ < 1) {
      print_usage();
      exit(1);
    }
    current_input = *argv;
    pFStack_48 = fopen(*argv,"rb");
    if (pFStack_48 == (FILE *)0x0) {
      fprintf(_stderr,"%s: couldn\'t open %s for reading\n",argv0,current_input);
      exit(1);
    }
    entry = (anm_entry_t *)anm_read_file((FILE *)pFStack_48,anm._4_4_);
    fclose(pFStack_48);
    if (option_unique_filenames == 0) {
      anm_build_name_lists((anm_archive_t *)entry);
    }
    if (iVar5 == 1) {
      node._4_4_ = 0;
      filename = entry->filename;
      while( true ) {
        if (filename == (char *)0x0) {
          local_160 = (char *)0x0;
        }
        else {
          local_160 = *(char **)(filename + 0x10);
        }
        name = local_160;
        if (filename == (char *)0x0) break;
        if (*(int *)(local_160 + 0x30) == 0) {
          pcStack_a8 = (char *)0x0;
          current_output = *(char **)(local_160 + 0x10);
          if (option_verbose != 0) {
            fprintf(_stderr,"%s\n",*(undefined8 *)(local_160 + 0x10));
          }
          if (option_unique_filenames != 0) {
            pcStack_a8 = anm_make_unique_filename(*(char **)(name + 0x10),*argv,node._4_4_);
          }
          if (pcStack_a8 == (char *)0x0) {
            local_170 = *(char **)(name + 0x10);
          }
          else {
            local_170 = pcStack_a8;
          }
          anm_extract((anm_entry_t *)name,local_170,anm._4_4_);
          free(pcStack_a8);
        }
        node._4_4_ = node._4_4_ + 1;
        filename = *(char **)filename;
      }
    }
    else {
      for (ind = 1; ind < iVar5; ind = ind + 1) {
        node_1._4_4_ = 0;
        filename_1 = entry->filename;
        while( true ) {
          if (filename_1 == (char *)0x0) {
            local_178 = (char *)0x0;
          }
          else {
            local_178 = *(char **)(filename_1 + 0x10);
          }
          name = local_178;
          if (filename_1 == (char *)0x0) break;
          if ((*(int *)(local_178 + 0x30) == 0) &&
             (iVar4 = strcmp(argv[ind],*(char **)(local_178 + 0x10)), iVar4 == 0)) {
            anms.tail = (list_node_t *)0x0;
            current_output = *(char **)(name + 0x10);
            if (option_verbose != 0) {
              fprintf(_stderr,"%s\n",*(undefined8 *)(name + 0x10));
            }
            if (option_unique_filenames != 0) {
              anms.tail = (list_node_t *)
                          anm_make_unique_filename(*(char **)(name + 0x10),*argv,node_1._4_4_);
            }
            if (anms.tail == (list_node_t *)0x0) {
              local_188 = *(list_node_t **)(name + 0x10);
            }
            else {
              local_188 = anms.tail;
            }
            anm_extract((anm_entry_t *)name,(char *)local_188,anm._4_4_);
            free(anms.tail);
          }
          node_1._4_4_ = node_1._4_4_ + 1;
          filename_1 = *(char **)filename_1;
        }
        fprintf(_stderr,"%s:%s: %s not found in archive\n",argv0,current_input,argv[ind]);
      }
    }
    anm_free((anm_archive_t *)entry);
    exit(0);
  }
  if (map_file._4_4_ != 3) {
    print_usage();
    exit(1);
  }
  if (anm._4_4_ == 0x13) {
    fprintf(_stderr,"%s: -r doesn\'t work with th19\n",argv0);
    exit(1);
  }
  current_output = argv[2];
  current_input = *argv;
  pFStack_48 = fopen(*argv,"rb");
  if (pFStack_48 == (FILE *)0x0) {
    fprintf(_stderr,"%s: couldn\'t open %s for reading\n",argv0,current_input);
    exit(1);
  }
  entry = (anm_entry_t *)anm_read_file((FILE *)pFStack_48,anm._4_4_);
  fclose(pFStack_48);
  symbolfp = (FILE *)fopen(*argv,"rb+");
  pFVar3 = _stderr;
  pcVar2 = current_input;
  pcVar1 = argv0;
  if ((FILE *)symbolfp == (FILE *)0x0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    fprintf(pFVar3,"%s: couldn\'t open %s for writing: %s\n",pcVar1,pcVar2,pcVar7);
    exit(1);
  }
  anm_build_name_lists((anm_archive_t *)entry);
  node_6 = (list_node_t *)entry->name;
  while( true ) {
    if (node_6 == (list_node_t *)0x0) {
      local_1d0 = (FILE *)0x0;
    }
    else {
      local_1d0 = (FILE *)node_6->data;
    }
    anmfp = local_1d0;
    if (node_6 == (list_node_t *)0x0) break;
    iVar5 = strcmp(argv[1],(char *)local_1d0);
    anm_00 = entry;
    anmfp_00 = symbolfp;
    if (iVar5 == 0) {
      entry_first = util_entry_by_name((anm_archive_t *)entry,(char *)anmfp);
      anm_replace((anm_archive_t *)anm_00,anmfp_00,entry_first,argv[2],anm._4_4_);
LAB_0010e68f:
      fclose((FILE *)symbolfp);
      anm_free((anm_archive_t *)entry);
      exit(0);
    }
    node_6 = node_6->next;
  }
  fprintf(_stderr,"%s:%s: %s not found in archive\n",argv0,current_input,argv[1]);
  goto LAB_0010e68f;
}

Assistant:

int
main(
    int argc,
    char* argv[])
{
    g_anmmap = anmmap_new();
    atexit(free_globals);

    const char commands[] = ":l:om:"
#ifdef HAVE_LIBPNG
                            "x:X:r:c:s:"
#endif
                            "Vfuv";
    int command = -1;

    FILE* in;
    unsigned version = 0;

    anm_archive_t* anm;
#ifdef HAVE_LIBPNG
    anm_entry_t* entry;
    char* name;

    FILE* anmfp;
    FILE* symbolfp = NULL;
    int i;
#endif

    argv0 = util_shortname(argv[0]);
    int opt;
    int ind = 0;
    while(argv[util_optind]) {
        switch(opt = util_getopt(argc,argv,commands)) {
        case 'c':
            if (option_print_offsets) {
                fprintf(stderr, "%s: 'o' option can't be used when creating ANM archive\n", argv0);
                exit(1);
            }
            /* fallthrough */
        case 'l':
        case 'x':
        case 'X':
        case 'r':
            if(command != -1) {
                fprintf(stderr,"%s: More than one mode specified\n",argv0);
                print_usage();
                exit(1);
            }
            command = opt;
            version = parse_version(util_optarg);
            break;
        case 'm': {
            FILE* map_file = NULL;
            map_file = fopen(util_optarg, "r");
            if (!map_file) {
                fprintf(stderr, "%s: couldn't open %s for reading: %s\n",
                    argv0, util_optarg, strerror(errno));
            } else {
                anmmap_load(g_anmmap, map_file, util_optarg);
                fclose(map_file);
            }
            break;
        }
        case 's':
            symbolfp = fopen(util_optarg, "w");
            if (!symbolfp) {
                fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                    argv0, util_optarg, strerror(errno));
            }
            break;
        case 'f':
            option_force = 1;
            break;
        case 'u':
            if (option_unique_filenames)
                option_dont_add_offset_border = 1;
            else
                option_unique_filenames = 1;
            break;
        case 'v':
            option_verbose++;
            break;
        case 'o':
            if (command == 'c') {
                fprintf(stderr, "%s: 'o' option can't be used when creating ANM archive\n", argv0);
                exit(1);
            }
            option_print_offsets = 1;
            break;
        default:
            util_getopt_default(&ind,argv,opt,print_usage);
        }
    }
    argc = ind;
    argv[argc] = NULL;

    if (command == -1) {
        print_usage();
        exit(1);
    }

    switch (version) {
    case 6:
    case 7:
    case 8:
    case 9:
    case 95:
    case 10:
    case 103:
    case 11:
    case 125:
    case 128:
    case 12:
    case 13:
    case 143:
    case 14:
    case 15:
    case 165:
    case 16:
    case 17:
    case 185:
    case 18:
    case 19:
    /* NEWHU: 19 */
        break;
    default:
        if (version == 0)
            fprintf(stderr, "%s: version must be specified\n", argv0);
        else
            fprintf(stderr, "%s: version %u is unsupported\n", argv0, version);
        exit(1);
    }

    switch (command) {
    case 'l':
        if (argc != 1) {
            print_usage();
            exit(1);
        }

        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);
        anm_dump(stdout, anm, version, argv[0]);

        anm_free(anm);
        exit(0);
#ifdef HAVE_LIBPNG
    case 'x':
        if (argc < 1) {
            print_usage();
            exit(1);
        }

        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);

        if (!option_unique_filenames)
            anm_build_name_lists(anm);

        if (argc == 1) {
            /* Extract all files. */
            int j = 0;
            list_for_each(&anm->entries, entry) {
                if (!entry->processed) {
                    char *filename = 0;
                    current_output = entry->name;
                    if (option_verbose >= 1)
                        fprintf(stderr, "%s\n", entry->name);
                    if (option_unique_filenames)
                        filename = anm_make_unique_filename(entry->name, argv[0], j);
                    anm_extract(entry, filename ? filename : entry->name, version);
                    free(filename);
                }
                j++;
            }
        } else {
            /* Extract all listed files. */
            for (i = 1; i < argc; ++i) {
                int j = 0;
                list_for_each(&anm->entries, entry) {
                    if (!entry->processed) {
                        if (strcmp(argv[i], entry->name) == 0) {
                            char *filename = 0;
                            current_output = entry->name;
                            if (option_verbose >= 1)
                                fprintf(stderr, "%s\n", entry->name);
                            if (option_unique_filenames)
                                filename = anm_make_unique_filename(entry->name, argv[0], j);
                            anm_extract(entry, filename ? filename : entry->name, version);
                            free(filename);
                            /* unfortunately we can't just skip to next argv, because of possible duplicates */
                        }
                    }
                    j++;
                }
                fprintf(stderr, "%s:%s: %s not found in archive\n",
                    argv0, current_input, argv[i]);
            }
        }

        anm_free(anm);
        exit(0);
    case 'X': {
        list_t anms;
        list_init(&anms);

        if (argc < 1) {
            print_usage();
            exit(1);
        }

        for (i = 0; i < argc; ++i) {
            current_input = argv[i];
            in = fopen(argv[i], "rb");
            if (!in) {
                fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
                exit(1);
            }
            anm = anm_read_file(in, version);
            list_append_new(&anms, anm);
            fclose(in);
        }

        anm_build_name_lists_multiple(&anms);

        i = 0;
        list_for_each(&anms, anm) {
            int j = 0;
            list_for_each(&anm->entries, entry) {
                if (!entry->processed) {
                    char *filename = 0;
                    current_output = entry->name;
                    if (option_verbose >= 1)
                        fprintf(stderr, "%s\n", entry->name);
                    if (option_unique_filenames)
                        filename = anm_make_unique_filename(entry->name, argv[i], j);
                    anm_extract(entry, filename ? filename : entry->name, version);
                    free(filename);
                }
                j++;
            }
            i++;
        }

        list_for_each(&anms, anm)
            anm_free(anm);
        list_free_nodes(&anms);
        exit(0);
    }
    case 'r':
        if (argc != 3) {
            print_usage();
            exit(1);
        }

        if (version == 19) {
            /* NEWHU: 19 */ /* FIXME: */
            fprintf(stderr, "%s: -r doesn't work with th19\n", argv0);
            exit(1);
        }

        current_output = argv[2];
        current_input = argv[0];
        in = fopen(argv[0], "rb");
        if (!in) {
            fprintf(stderr, "%s: couldn't open %s for reading\n", argv0, current_input);
            exit(1);
        }
        anm = anm_read_file(in, version);
        fclose(in);

        anmfp = fopen(argv[0], "rb+");
        if (!anmfp) {
            fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
                argv0, current_input, strerror(errno));
            exit(1);
        }

        anm_build_name_lists(anm);
        list_for_each(&anm->names, name) {
            if (strcmp(argv[1], name) == 0) {
                anm_replace(anm, anmfp, util_entry_by_name(anm, name), argv[2], version);
                goto replace_done;
            }
        }

        fprintf(stderr, "%s:%s: %s not found in archive\n",
            argv0, current_input, argv[1]);

replace_done:

        fclose(anmfp);

#if 0
        offset = 0;
        list_for_each(&anm->entries, entry) {
            unsigned int nextoffset = entry->header->nextoffset;
            if (strcmp(argv[1], entry->name) == 0 && entry->header->hasdata) {
                if (!file_seek(anmfp,
                    offset + entry->header->thtxoffset + 4 + sizeof(thtx_header_t)))
                    exit(1);
                if (!file_write(anmfp, entry->data, entry->thtx->size))
                    exit(1);
            }
            offset += nextoffset;
        }
#endif

        anm_free(anm);
        exit(0);
    case 'c':
        if (argc != 2) {
            print_usage();
            exit(1);
        }
        current_input = argv[1];
        anm = anm_create(argv[1], symbolfp, version);

        if (symbolfp)
            fclose(symbolfp);

        if (anm == NULL)
            exit(0);

        anm_defaults(anm, version);

        /* Allocate enough space for the THTX data. */
        if (!option_unique_filenames)
            anm_build_name_lists(anm);
        list_for_each(&anm->entries, entry) {
            if (entry->header->hasdata && !entry->data) {
                /* XXX: There are a few entries with a thtx.size greater than
                 *      w*h*Bpp.  The extra data appears to be all zeroes. */
                entry->data = calloc(1, entry->thtx->size);
            }
        }
        list_for_each(&anm->entries, entry) {
            if (!entry->processed)
                anm_replace(anm, NULL, entry, entry->filename ? entry->filename : entry->name, version);
        }

        current_output = argv[0];
        anm_write(anm, argv[0], version);

        anm_free(anm);
        exit(0);
#endif
    default:
        print_usage();
        exit(1);
    }
}